

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecUtil.c
# Opt level: O1

Vec_Int_t * Gia_PolynCollectLastXor(Gia_Man_t *pGia,int fVerbose)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *vXors;
  int *piVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  Gia_Obj_t *pGVar7;
  
  vXors = (Vec_Int_t *)malloc(0x10);
  vXors->nCap = 100;
  vXors->nSize = 0;
  piVar3 = (int *)malloc(400);
  vXors->pArray = piVar3;
  lVar5 = (long)pGia->vCos->nSize;
  if (lVar5 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar6 = pGia->vCos->pArray[lVar5 + -1];
  if ((-1 < (long)iVar6) && (iVar6 < pGia->nObjs)) {
    pGVar7 = pGia->pObjs + iVar6;
    if (pGia->pRefs != (int *)0x0) {
      free(pGia->pRefs);
      pGia->pRefs = (int *)0x0;
    }
    Gia_ManCreateRefs(pGia);
    Gia_ManIncrementTravId(pGia);
    pGVar2 = pGia->pObjs;
    if ((pGVar2 <= pGVar7) && (pGVar7 < pGVar2 + pGia->nObjs)) {
      Gia_PolynCollectXors_rec
                (pGia,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555 -
                      (*(uint *)pGVar7 & 0x1fffffff),vXors);
      iVar6 = vXors->nSize;
      if (1 < iVar6) {
        piVar3 = vXors->pArray;
        iVar4 = -1;
        lVar5 = 0;
        do {
          iVar1 = piVar3[lVar5];
          piVar3[lVar5] = piVar3[iVar6 + iVar4];
          piVar3[vXors->nSize + iVar4] = iVar1;
          lVar5 = lVar5 + 1;
          iVar6 = vXors->nSize;
          iVar4 = iVar4 + -1;
        } while (lVar5 < iVar6 / 2);
      }
      if (pGia->pRefs != (int *)0x0) {
        free(pGia->pRefs);
        pGia->pRefs = (int *)0x0;
      }
      return vXors;
    }
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

Vec_Int_t * Gia_PolynCollectLastXor( Gia_Man_t * pGia, int fVerbose )
{
    Vec_Int_t * vXors = Vec_IntAlloc( 100 );
    Gia_Obj_t * pObj = Gia_ManCo( pGia, Gia_ManCoNum(pGia)-1 );
    ABC_FREE( pGia->pRefs );
    Gia_ManCreateRefs( pGia );
    Gia_ManIncrementTravId( pGia );
    Gia_PolynCollectXors_rec( pGia, Gia_ObjFaninId0p(pGia, pObj), vXors );
    Vec_IntReverseOrder( vXors );
    ABC_FREE( pGia->pRefs );
    return vXors;
}